

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_node_short_edge
          (REF_GRID ref_grid,REF_INT node,REF_DBL *short_edge,REF_DBL *short_diag,REF_INT *short_id)

{
  uint uVar1;
  double local_98;
  double local_88;
  int local_7c;
  double local_78;
  REF_INT local_6c;
  int local_68;
  double dStack_60;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL max_diag;
  REF_DBL min_diag;
  REF_DBL diag;
  REF_INT geom;
  REF_INT item;
  REF_GEOM ref_geom;
  REF_INT *short_id_local;
  REF_DBL *short_diag_local;
  REF_DBL *short_edge_local;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  _geom = ref_grid->geom;
  *short_edge = 1.0;
  *short_diag = 1e+200;
  *short_id = -1;
  max_diag = 1e+200;
  dStack_60 = -1e+200;
  if ((node < 0) || (_geom->ref_adj->nnode <= node)) {
    local_68 = -1;
  }
  else {
    local_68 = _geom->ref_adj->first[node];
  }
  diag._4_4_ = local_68;
  if (local_68 == -1) {
    local_6c = -1;
  }
  else {
    local_6c = _geom->ref_adj->item[local_68].ref;
  }
  diag._0_4_ = local_6c;
  ref_geom = (REF_GEOM)short_id;
  short_id_local = (REF_INT *)short_diag;
  short_diag_local = short_edge;
  short_edge_local._4_4_ = node;
  pRStack_18 = ref_grid;
  do {
    if (diag._4_4_ == -1) {
      if (dStack_60 * 1e+20 <= 0.0) {
        local_88 = -(dStack_60 * 1e+20);
      }
      else {
        local_88 = dStack_60 * 1e+20;
      }
      if (max_diag <= 0.0) {
        local_98 = -max_diag;
      }
      else {
        local_98 = max_diag;
      }
      if (local_98 < local_88) {
        *short_diag_local = max_diag / dStack_60;
      }
      return 0;
    }
    if (_geom->descr[diag._0_4_ * 6] == 1) {
      uVar1 = ref_egads_diagonal(_geom,diag._0_4_,&min_diag);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xa74,"ref_geom_node_short_edge",(ulong)uVar1,"edge diag");
        return uVar1;
      }
      if (min_diag < max_diag) {
        max_diag = min_diag;
        *(REF_DBL *)short_id_local = min_diag;
        ref_geom->n = _geom->descr[diag._0_4_ * 6 + 1];
      }
      if (min_diag <= dStack_60) {
        local_78 = dStack_60;
      }
      else {
        local_78 = min_diag;
      }
      dStack_60 = local_78;
    }
    diag._4_4_ = _geom->ref_adj->item[diag._4_4_].next;
    if (diag._4_4_ == -1) {
      local_7c = -1;
    }
    else {
      local_7c = _geom->ref_adj->item[diag._4_4_].ref;
    }
    diag._0_4_ = local_7c;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_geom_node_short_edge(REF_GRID ref_grid,
                                                   REF_INT node,
                                                   REF_DBL *short_edge,
                                                   REF_DBL *short_diag,
                                                   REF_INT *short_id) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item, geom;
  REF_DBL diag, min_diag, max_diag;
  *short_edge = 1.0;
  *short_diag = REF_DBL_MAX;
  *short_id = REF_EMPTY;
  min_diag = REF_DBL_MAX;
  max_diag = REF_DBL_MIN;
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (REF_GEOM_EDGE != ref_geom_type(ref_geom, geom)) continue;
    RSS(ref_egads_diagonal(ref_geom, geom, &diag), "edge diag");
    if (diag < min_diag) {
      min_diag = diag;
      *short_diag = diag;
      *short_id = ref_geom_id(ref_geom, geom);
    }
    max_diag = MAX(diag, max_diag);
  }
  if (ref_math_divisible(min_diag, max_diag)) {
    *short_edge = min_diag / max_diag;
  }
  return REF_SUCCESS;
}